

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.cxx
# Opt level: O0

Fl_Tree_Item * __thiscall
Fl_Tree_Item::add(Fl_Tree_Item *this,Fl_Tree_Prefs *prefs,char *new_label,Fl_Tree_Item *item)

{
  Fl_Tree_Sort FVar1;
  int iVar2;
  Fl_Tree_Item *pFVar3;
  char *pcVar4;
  Fl_Tree_Item *c_1;
  int t_1;
  Fl_Tree_Item *c;
  int t;
  Fl_Tree_Item *local_30;
  Fl_Tree_Item *item_local;
  char *new_label_local;
  Fl_Tree_Prefs *prefs_local;
  Fl_Tree_Item *this_local;
  
  local_30 = item;
  if (item == (Fl_Tree_Item *)0x0) {
    local_30 = (Fl_Tree_Item *)operator_new(0x88);
    Fl_Tree_Item(local_30,prefs);
    label(local_30,new_label);
  }
  recalc_tree(this);
  local_30->_parent = this;
  FVar1 = Fl_Tree_Prefs::sortorder(prefs);
  if (FVar1 == FL_TREE_SORT_NONE) {
    Fl_Tree_Item_Array::add(&this->_children,local_30);
  }
  else if (FVar1 == FL_TREE_SORT_ASCENDING) {
    for (c._0_4_ = 0; iVar2 = Fl_Tree_Item_Array::total(&this->_children), (int)c < iVar2;
        c._0_4_ = (int)c + 1) {
      pFVar3 = Fl_Tree_Item_Array::operator[](&this->_children,(int)c);
      pcVar4 = label(pFVar3);
      if (pcVar4 != (char *)0x0) {
        pcVar4 = label(pFVar3);
        iVar2 = strcmp(pcVar4,new_label);
        if (0 < iVar2) {
          Fl_Tree_Item_Array::insert(&this->_children,(int)c,local_30);
          return local_30;
        }
      }
    }
    Fl_Tree_Item_Array::add(&this->_children,local_30);
  }
  else if (FVar1 == FL_TREE_SORT_DESCENDING) {
    for (c_1._4_4_ = 0; iVar2 = Fl_Tree_Item_Array::total(&this->_children), c_1._4_4_ < iVar2;
        c_1._4_4_ = c_1._4_4_ + 1) {
      pFVar3 = Fl_Tree_Item_Array::operator[](&this->_children,c_1._4_4_);
      pcVar4 = label(pFVar3);
      if (pcVar4 != (char *)0x0) {
        pcVar4 = label(pFVar3);
        iVar2 = strcmp(pcVar4,new_label);
        if (iVar2 < 0) {
          Fl_Tree_Item_Array::insert(&this->_children,c_1._4_4_,local_30);
          return local_30;
        }
      }
    }
    Fl_Tree_Item_Array::add(&this->_children,local_30);
  }
  return local_30;
}

Assistant:

Fl_Tree_Item *Fl_Tree_Item::add(const Fl_Tree_Prefs &prefs,
			        const char *new_label,
				Fl_Tree_Item *item) {
#if FLTK_ABI_VERSION >= 10303
  if ( !item )
    { item = new Fl_Tree_Item(_tree); item->label(new_label); }
#else
  if ( !item )
    { item = new Fl_Tree_Item(prefs); item->label(new_label); }
#endif
  recalc_tree();		// may change tree geometry
  item->_parent = this;
  switch ( prefs.sortorder() ) {
    case FL_TREE_SORT_NONE: {
      _children.add(item);
      return(item);
    }
    case FL_TREE_SORT_ASCENDING: {
      for ( int t=0; t<_children.total(); t++ ) {
        Fl_Tree_Item *c = _children[t];
        if ( c->label() && strcmp(c->label(), new_label) > 0 ) {
          _children.insert(t, item);
          return(item);
        }
      }
      _children.add(item);
      return(item);
    }
    case FL_TREE_SORT_DESCENDING: {
      for ( int t=0; t<_children.total(); t++ ) {
        Fl_Tree_Item *c = _children[t];
        if ( c->label() && strcmp(c->label(), new_label) < 0 ) {
          _children.insert(t, item);
          return(item);
        }
      }
      _children.add(item);
      return(item);
    }
  }
  return(item);
}